

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_object.cpp
# Opt level: O0

char * mjs::type_string(native_error_type e)

{
  char *pcStack_10;
  native_error_type e_local;
  
  switch(e) {
  case generic:
    pcStack_10 = "Error";
    break;
  case eval:
    pcStack_10 = "EvalError";
    break;
  case range:
    pcStack_10 = "RangeError";
    break;
  case reference:
    pcStack_10 = "ReferenceError";
    break;
  case syntax:
    pcStack_10 = "SyntaxError";
    break;
  case type:
    pcStack_10 = "TypeError";
    break;
  case uri:
    pcStack_10 = "URIError";
    break;
  case assertion:
    pcStack_10 = "AssertionError";
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/error_object.cpp"
                  ,0x1b,"const char *mjs::type_string(native_error_type)");
  }
  return pcStack_10;
}

Assistant:

constexpr const char* type_string(native_error_type e) {
    switch (e) {
    case native_error_type::generic:
        return "Error";
    case native_error_type::eval:
        return "EvalError";
    case native_error_type::range:
        return "RangeError";
    case native_error_type::reference:
        return "ReferenceError";
    case native_error_type::syntax:
        return "SyntaxError";
    case native_error_type::type:
        return "TypeError";
    case native_error_type::uri:
        return "URIError";
    case native_error_type::assertion:
        return "AssertionError";
    default:
        assert(false);
        throw std::runtime_error("Invalid error type " + std::to_string(static_cast<int>(e)));
    }
}